

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O3

shared_ptr<Token> __thiscall Lexer::scan(Lexer *this)

{
  ifstream *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  iterator iVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  undefined **ppuVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  char cVar14;
  Lexer *in_RSI;
  shared_ptr<Token> sVar15;
  stringstream ss;
  undefined1 local_209;
  Lexer *local_208;
  float local_1fc;
  key_type local_1f8;
  shared_ptr<Word> local_1d8;
  Tag local_1bc;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  piVar1 = &in_RSI->is;
LAB_00107f7f:
  bVar3 = in_RSI->peek;
  uVar7 = (uint)bVar3;
  if (bVar3 < 0xd) {
    if (bVar3 != 9) {
      if (bVar3 != 10) goto LAB_0010812c;
      line = line + 1;
    }
  }
  else if (bVar3 < 0x20) {
    if (bVar3 != 0xd) goto LAB_0010812c;
  }
  else if (0x20 < bVar3) goto LAB_00107fd6;
  std::istream::get((char *)piVar1);
  if (((&in_RSI->field_0x58)[*(long *)(*(long *)&in_RSI->is + -0x18)] & 2) != 0) {
    in_RSI->peek = '\0';
  }
  goto LAB_00107f7f;
LAB_00107fd6:
  if (bVar3 < 0x3d) {
    if (bVar3 == 0x21) {
      bVar5 = readch(in_RSI,'=');
      if (!bVar5) {
        puVar11 = (undefined8 *)operator_new(0x20);
        puVar11[1] = 0x100000001;
        *puVar11 = &PTR___Sp_counted_ptr_inplace_0012aad0;
        puVar10 = puVar11 + 2;
        puVar11[2] = &PTR_toString_abi_cxx11__0012ab48;
        *(undefined4 *)(puVar11 + 3) = 0x21;
LAB_001083d3:
        ppuVar13 = &PTR_toString_abi_cxx11__0012ab48;
        *(undefined8 **)&(this->words)._M_t._M_impl = puVar11;
        *(undefined8 **)this = puVar10;
        goto LAB_001083db;
      }
      *(element_type **)this = Word::Ne.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var9 = Word::Ne.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ppuVar13 = (undefined **)extraout_RDX_01;
    }
    else if (bVar3 == 0x26) {
      bVar5 = readch(in_RSI,'&');
      if (!bVar5) {
        puVar11 = (undefined8 *)operator_new(0x20);
        puVar11[1] = 0x100000001;
        *puVar11 = &PTR___Sp_counted_ptr_inplace_0012aad0;
        puVar10 = puVar11 + 2;
        puVar11[2] = &PTR_toString_abi_cxx11__0012ab48;
        *(undefined4 *)(puVar11 + 3) = 0x26;
        goto LAB_001083d3;
      }
      *(element_type **)this = Word::And.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      _Var9 = Word::And.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ppuVar13 = (undefined **)extraout_RDX_03;
    }
    else {
      if (bVar3 != 0x3c) {
LAB_0010812c:
        if ((int)(char)bVar3 - 0x30U < 10) {
          iVar8 = 0;
          do {
            iVar6 = toDigit(in_RSI,(char)uVar7);
            iVar8 = iVar6 + iVar8 * 10;
            std::istream::get((char *)piVar1);
            if (((&in_RSI->field_0x58)[*(long *)(*(long *)&in_RSI->is + -0x18)] & 2) != 0) {
              in_RSI->peek = '\0';
              goto LAB_001084f9;
            }
            uVar7 = (uint)in_RSI->peek;
          } while (uVar7 - 0x30 < 10);
          if (in_RSI->peek == '.') {
            local_208 = (Lexer *)CONCAT44(local_208._4_4_,(float)iVar8);
            std::istream::get((char *)piVar1);
            if (((&in_RSI->field_0x58)[*(long *)(*(long *)&in_RSI->is + -0x18)] & 2) == 0) {
              local_1fc = 10.0;
              do {
                if (9 < (int)in_RSI->peek - 0x30U) goto LAB_0010821f;
                iVar8 = toDigit(in_RSI,in_RSI->peek);
                local_208 = (Lexer *)CONCAT44(local_208._4_4_,
                                              local_208._0_4_ + (float)iVar8 / local_1fc);
                local_1fc = local_1fc * 10.0;
                std::istream::get((char *)piVar1);
              } while (((&in_RSI->field_0x58)[*(long *)(*(long *)&in_RSI->is + -0x18)] & 2) == 0);
            }
            in_RSI->peek = '\0';
LAB_0010821f:
            puVar10 = (undefined8 *)operator_new(0x20);
            puVar10[1] = 0x100000001;
            *puVar10 = &PTR___Sp_counted_ptr_inplace_0012abf0;
            *(undefined4 *)(puVar10 + 3) = 0x110;
            ppuVar13 = &PTR_toString_abi_cxx11__0012ac40;
            puVar10[2] = &PTR_toString_abi_cxx11__0012ac40;
            *(float *)((long)puVar10 + 0x1c) = local_208._0_4_;
          }
          else {
LAB_001084f9:
            puVar10 = (undefined8 *)operator_new(0x20);
            puVar10[1] = 0x100000001;
            *puVar10 = &PTR___Sp_counted_ptr_inplace_0012ab70;
            *(undefined4 *)(puVar10 + 3) = 0x10e;
            ppuVar13 = &PTR_toString_abi_cxx11__0012abc0;
            puVar10[2] = &PTR_toString_abi_cxx11__0012abc0;
            *(int *)((long)puVar10 + 0x1c) = iVar8;
          }
          *(undefined8 **)this = puVar10 + 2;
          *(undefined8 **)&(this->words)._M_t._M_impl = puVar10;
        }
        else {
          iVar8 = isalpha((int)(char)bVar3);
          if (iVar8 == 0) {
            puVar10 = (undefined8 *)operator_new(0x20);
            puVar10[1] = 0x100000001;
            *puVar10 = &PTR___Sp_counted_ptr_inplace_0012aad0;
            cVar14 = in_RSI->peek;
            ppuVar13 = (undefined **)(ulong)(uint)(int)cVar14;
            puVar10[2] = &PTR_toString_abi_cxx11__0012ab48;
            *(int *)(puVar10 + 3) = (int)cVar14;
            *(undefined8 **)&(this->words)._M_t._M_impl = puVar10;
            *(undefined8 **)this = puVar10 + 2;
            in_RSI->peek = ' ';
          }
          else {
            local_208 = this;
            std::__cxx11::stringstream::stringstream(local_1b8);
            cVar14 = in_RSI->peek;
            do {
              local_1f8._M_dataplus._M_p._0_1_ = cVar14;
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1f8,1);
              std::istream::get((char *)piVar1);
              if (((&in_RSI->field_0x58)[*(long *)(*(long *)&in_RSI->is + -0x18)] & 2) == 0) {
                cVar14 = in_RSI->peek;
              }
              else {
                in_RSI->peek = '\0';
                cVar14 = '\0';
              }
              iVar8 = isalpha((int)cVar14);
            } while ((int)cVar14 - 0x30U < 10 || iVar8 != 0);
            std::__cxx11::stringbuf::str();
            iVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                     ::find(&(in_RSI->words)._M_t,&local_1f8);
            paVar2 = &local_1f8.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p) !=
                paVar2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                       (char)local_1f8._M_dataplus._M_p),
                              local_1f8.field_2._M_allocated_capacity + 1);
            }
            if ((_Rb_tree_header *)iVar12._M_node ==
                &(in_RSI->words)._M_t._M_impl.super__Rb_tree_header) {
              std::__cxx11::stringbuf::str();
              local_1bc = ID;
              local_1d8.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<Word,std::allocator<Word>,std::__cxx11::string,Tag>
                        (&local_1d8.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ,(Word **)&local_1d8,(allocator<Word> *)&local_209,&local_1f8,&local_1bc);
              this = local_208;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p) !=
                  paVar2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                         (char)local_1f8._M_dataplus._M_p),
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>>>
              ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<Word>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>>>
                          *)&in_RSI->words,&local_1f8,&local_1d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p) !=
                  paVar2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                         (char)local_1f8._M_dataplus._M_p),
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              *(element_type **)this =
                   local_1d8.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->words)._M_t._M_impl =
                   local_1d8.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            }
            else {
              *(undefined8 *)local_208 = *(undefined8 *)(iVar12._M_node + 2);
              p_Var4 = iVar12._M_node[2]._M_parent;
              *(_Base_ptr *)&(local_208->words)._M_t._M_impl = p_Var4;
              this = local_208;
              if (p_Var4 != (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&p_Var4->_M_parent = *(int *)&p_Var4->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&p_Var4->_M_parent = *(int *)&p_Var4->_M_parent + 1;
                }
              }
            }
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
            ppuVar13 = (undefined **)extraout_RDX_05;
          }
        }
        goto LAB_001083db;
      }
      bVar5 = readch(in_RSI,'=');
      if (!bVar5) {
        puVar11 = (undefined8 *)operator_new(0x20);
        puVar11[1] = 0x100000001;
        *puVar11 = &PTR___Sp_counted_ptr_inplace_0012aad0;
        puVar10 = puVar11 + 2;
        puVar11[2] = &PTR_toString_abi_cxx11__0012ab48;
        *(undefined4 *)(puVar11 + 3) = 0x3c;
        goto LAB_001083d3;
      }
      *(element_type **)this = Word::Le.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var9 = Word::Le.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ppuVar13 = (undefined **)extraout_RDX;
    }
  }
  else if (bVar3 == 0x3d) {
    bVar5 = readch(in_RSI,'=');
    if (!bVar5) {
      puVar11 = (undefined8 *)operator_new(0x20);
      puVar11[1] = 0x100000001;
      *puVar11 = &PTR___Sp_counted_ptr_inplace_0012aad0;
      puVar10 = puVar11 + 2;
      puVar11[2] = &PTR_toString_abi_cxx11__0012ab48;
      *(undefined4 *)(puVar11 + 3) = 0x3d;
      goto LAB_001083d3;
    }
    *(element_type **)this = Word::Eq.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var9 = Word::Eq.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ppuVar13 = (undefined **)extraout_RDX_02;
  }
  else if (bVar3 == 0x3e) {
    bVar5 = readch(in_RSI,'=');
    if (!bVar5) {
      puVar11 = (undefined8 *)operator_new(0x20);
      puVar11[1] = 0x100000001;
      *puVar11 = &PTR___Sp_counted_ptr_inplace_0012aad0;
      puVar10 = puVar11 + 2;
      puVar11[2] = &PTR_toString_abi_cxx11__0012ab48;
      *(undefined4 *)(puVar11 + 3) = 0x3e;
      goto LAB_001083d3;
    }
    *(element_type **)this = Word::Ge.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var9 = Word::Ge.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ppuVar13 = (undefined **)extraout_RDX_04;
  }
  else {
    if (bVar3 != 0x7c) goto LAB_0010812c;
    bVar5 = readch(in_RSI,'\"');
    if (!bVar5) {
      puVar11 = (undefined8 *)operator_new(0x20);
      puVar11[1] = 0x100000001;
      *puVar11 = &PTR___Sp_counted_ptr_inplace_0012aad0;
      puVar10 = puVar11 + 2;
      puVar11[2] = &PTR_toString_abi_cxx11__0012ab48;
      *(undefined4 *)(puVar11 + 3) = 0x7c;
      goto LAB_001083d3;
    }
    *(element_type **)this = Word::Or.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var9 = Word::Or.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ppuVar13 = (undefined **)extraout_RDX_00;
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->words)._M_t._M_impl = _Var9._M_pi;
  if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var9._M_pi)->_M_use_count = (_Var9._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var9._M_pi)->_M_use_count = (_Var9._M_pi)->_M_use_count + 1;
    }
  }
LAB_001083db:
  sVar15.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar13;
  sVar15.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Token>)sVar15.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> scan() {

		// Skip whitespace characters
		for (;; readch()) {
			if (peek == ' ' || peek == '\t' || peek == '\r') continue;
			else if (peek == '\n') line++;
			else break;
		}

		// Recognize complex tokens that consist of two or more characters
		switch (peek)
		{
		case '&':
			if (readch('&')) return Word::And;
			else return std::make_shared<Token>('&');
			break;
		case '|':
			if (readch('"')) return Word::Or;
			else return std::make_shared<Token>('|');
			break;
		case '=':
			if (readch('=')) return Word::Eq;
			else return std::make_shared<Token>('=');
			break;
		case '!':
			if (readch('=')) return Word::Ne;
			else return std::make_shared<Token>('!');
			break;
		case '<':
			if (readch('=')) return Word::Le;
			else return std::make_shared<Token>('<');
			break;
		case '>':
			if (readch('=')) return Word::Ge;
			else return std::make_shared<Token>('>');
			break;
		default:
			break;
		}

		// Number recognition
		if (std::isdigit(peek)) {
			int v = 0;
			do {
				v = v * 10 + toDigit(peek); readch();
			} while (std::isdigit(peek));

			if (peek != '.') return  std::make_shared<Num>(v);
			float x = (float)v; float d = 10.f;

			for (;;) {
				readch();
				if (!std::isdigit(peek)) break;
				x += toDigit(peek) / d; d *= 10;
			}
			return std::make_shared<Real>(x);
		}

		// String recognition
		if (std::isalpha(peek)) {
			std::stringstream ss;
			do {
				ss << peek; readch();
			} while (std::isalpha(peek) || std::isdigit(peek));
			auto result = words.find(ss.str());
			if (result != words.end()) return result->second;
			std::shared_ptr<Word> w = std::make_shared<Word>(ss.str(), ID);
			words.emplace(ss.str(), w);
			return w;
		}

		// Other tokens recognition
		std::shared_ptr<Token> t = std::make_shared<Token>(peek);
		peek = ' ';
		return t;
	}